

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool GetPolicyDefault(cmMakefile *mf,string *policy,PolicyStatus *defaultSetting)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_210;
  undefined1 local_1f0 [8];
  ostringstream e;
  allocator local_75 [13];
  undefined1 local_68 [8];
  string defaultValue;
  string defaultVar;
  PolicyStatus *defaultSetting_local;
  string *policy_local;
  cmMakefile *mf_local;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&defaultValue.field_2 + 8);
  std::operator+(__return_storage_ptr__,"CMAKE_POLICY_DEFAULT_",policy);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_68,pcVar2,local_75);
  std::allocator<char>::~allocator((allocator<char> *)local_75);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68,"NEW");
  if (bVar1) {
    *defaultSetting = NEW;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"OLD");
    if (bVar1) {
      *defaultSetting = OLD;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_68,"");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        poVar3 = std::operator<<((ostream *)local_1f0,
                                 (string *)(defaultValue.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3," has value \"");
        poVar3 = std::operator<<(poVar3,(string *)local_68);
        std::operator<<(poVar3,"\" but must be \"OLD\", \"NEW\", or \"\" (empty).");
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        mf_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
        goto LAB_005358eb;
      }
      *defaultSetting = WARN;
    }
  }
  mf_local._7_1_ = true;
LAB_005358eb:
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(defaultValue.field_2._M_local_buf + 8));
  return mf_local._7_1_;
}

Assistant:

static bool GetPolicyDefault(cmMakefile* mf, std::string const& policy,
                             cmPolicies::PolicyStatus* defaultSetting)
{
  std::string defaultVar = "CMAKE_POLICY_DEFAULT_" + policy;
  std::string defaultValue = mf->GetSafeDefinition(defaultVar);
  if (defaultValue == "NEW") {
    *defaultSetting = cmPolicies::NEW;
  } else if (defaultValue == "OLD") {
    *defaultSetting = cmPolicies::OLD;
  } else if (defaultValue == "") {
    *defaultSetting = cmPolicies::WARN;
  } else {
    std::ostringstream e;
    e << defaultVar << " has value \"" << defaultValue
      << "\" but must be \"OLD\", \"NEW\", or \"\" (empty).";
    mf->IssueMessage(cmake::FATAL_ERROR, e.str());
    return false;
  }

  return true;
}